

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  Inst *this_00;
  Frag FVar1;
  Frag FVar2;
  uint local_50;
  uint uStack_4c;
  uint local_48;
  int iStack_44;
  uint32_t local_40;
  
  local_40 = a.begin;
  if (((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    local_50 = AllocInst(this,1);
    if ((int)local_50 < 0) {
      local_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      iStack_44 = (uint)iStack_44._1_3_ << 8;
    }
    else {
      this_00 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + local_50;
      uStack_4c = local_50 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(this_00,0,local_40);
      }
      else {
        Prog::Inst::InitAlt(this_00,local_40,0);
        uStack_4c = uStack_4c | 1;
      }
      PatchList::Patch((this->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,a.end,local_50)
      ;
      iStack_44 = CONCAT31(iStack_44._1_3_,1);
      local_48 = uStack_4c;
    }
  }
  else {
    FVar1 = Plus(this,a,nongreedy);
    FVar2._8_8_ = FVar1._8_8_ & 0xffffffffff;
    FVar2.begin = (int)FVar1._0_8_;
    FVar2.end.head = (int)((ulong)FVar1._0_8_ >> 0x20);
    FVar2 = Quest(this,FVar2,nongreedy);
    local_50 = FVar2.begin;
    uStack_4c = FVar2.end.head;
    local_48 = FVar2.end.tail;
    iStack_44 = CONCAT31(iStack_44._1_3_,FVar2.nullable);
  }
  FVar1.end.head = uStack_4c;
  FVar1.begin = local_50;
  FVar1.end.tail = local_48;
  FVar1._12_4_ = iStack_44;
  return FVar1;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  // When the subexpression is nullable, one Alt isn't enough to guarantee
  // correct priority ordering within the transitive closure. The simplest
  // solution is to handle it as (a+)? instead, which adds the second Alt.
  if (a.nullable)
    return Quest(Plus(a, nongreedy), nongreedy);

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(id, pl, true);
}